

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_biquad_init(ma_biquad_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks,
                        ma_biquad *pBQ)

{
  ma_result mVar1;
  ma_allocation_callbacks *pAllocationCallbacks_00;
  size_t *in_RDX;
  ma_biquad *in_RSI;
  void *in_RDI;
  void *pHeap;
  size_t heapSizeInBytes;
  ma_result result;
  size_t in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  mVar1 = ma_biquad_get_heap_size((ma_biquad_config *)in_RSI,in_RDX);
  if (mVar1 == MA_SUCCESS) {
    if (in_stack_ffffffffffffffd0 == (void *)0x0) {
      pAllocationCallbacks_00 = (ma_allocation_callbacks *)0x0;
    }
    else {
      pAllocationCallbacks_00 =
           (ma_allocation_callbacks *)
           ma_malloc(in_stack_ffffffffffffffc8,(ma_allocation_callbacks *)0x212621);
      if (pAllocationCallbacks_00 == (ma_allocation_callbacks *)0x0) {
        return MA_OUT_OF_MEMORY;
      }
    }
    mVar1 = ma_biquad_init_preallocated
                      ((ma_biquad_config *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI);
    if (mVar1 == MA_SUCCESS) {
      *(undefined4 *)(in_RDX + 7) = 1;
      mVar1 = MA_SUCCESS;
    }
    else {
      ma_free(in_stack_ffffffffffffffd0,pAllocationCallbacks_00);
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_biquad_init(const ma_biquad_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_biquad* pBQ)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_biquad_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_biquad_init_preallocated(pConfig, pHeap, pBQ);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pBQ->_ownsHeap = MA_TRUE;
    return MA_SUCCESS;
}